

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void __thiscall LogMessage::Flush(LogMessage *this)

{
  string s;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->str_,"\n",1);
  std::__cxx11::stringbuf::str();
  fwrite(s._M_dataplus._M_p,1,s._M_string_length,_stderr);
  this->flushed_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Flush() {
    stream() << "\n";
    std::string s = str_.str();
    size_t n = s.size();
    if (fwrite(s.data(), 1, n, stderr) < n) {}  // shut up gcc
    flushed_ = true;
  }